

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

void KINFree(void **kinmem)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = *kinmem;
  if (pvVar1 != (void *)0x0) {
    if (*(N_Vector *)((long)pvVar1 + 0x108) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x108));
    }
    if (*(N_Vector *)((long)pvVar1 + 0x110) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x110));
    }
    if (*(N_Vector *)((long)pvVar1 + 0x130) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x130));
    }
    if (*(N_Vector *)((long)pvVar1 + 0x140) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x140));
    }
    if (*(N_Vector *)((long)pvVar1 + 0x148) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x148));
    }
    if ((*(int *)((long)pvVar1 + 0x28) == 2) &&
       (*(N_Vector *)((long)pvVar1 + 0x118) != (N_Vector)0x0)) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x118));
    }
    if (((*(uint *)((long)pvVar1 + 0x28) & 0xfffffffe) == 2) && (0 < *(long *)((long)pvVar1 + 400)))
    {
      free(*(void **)((long)pvVar1 + 0x180));
      free(*(void **)((long)pvVar1 + 0x178));
      free(*(void **)((long)pvVar1 + 0x188));
    }
    if (*(long *)((long)pvVar1 + 400) != 0) {
      if (*(N_Vector *)((long)pvVar1 + 0x150) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x150));
      }
      if (*(N_Vector *)((long)pvVar1 + 0x158) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x158));
      }
      N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x160),*(int *)((long)pvVar1 + 400));
      N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x168),*(int *)((long)pvVar1 + 400));
      free(*(void **)((long)pvVar1 + 0x1a0));
      free(*(void **)((long)pvVar1 + 0x1a8));
      lVar2 = *(long *)((long)pvVar1 + 400) * 2;
      *(long *)((long)pvVar1 + 0x1c0) =
           (*(long *)((long)pvVar1 + 0x1c0) - *(long *)((long)pvVar1 + 0x1b0) * lVar2) + -2;
      *(long *)((long)pvVar1 + 0x1c8) =
           (*(long *)((long)pvVar1 + 0x1c8) - lVar2 * *(long *)((long)pvVar1 + 0x1b8)) + -2;
      if (*(int *)((long)pvVar1 + 0x198) != 0) {
        N_VDestroyVectorArray
                  (*(N_Vector **)((long)pvVar1 + 0x170),(int)*(long *)((long)pvVar1 + 400));
        *(long *)((long)pvVar1 + 0x1c0) =
             *(long *)((long)pvVar1 + 0x1c0) -
             *(long *)((long)pvVar1 + 0x1b0) * *(long *)((long)pvVar1 + 400);
        *(long *)((long)pvVar1 + 0x1c8) =
             *(long *)((long)pvVar1 + 0x1c8) -
             *(long *)((long)pvVar1 + 400) * *(long *)((long)pvVar1 + 0x1b8);
      }
    }
    *(long *)((long)pvVar1 + 0x1c0) =
         *(long *)((long)pvVar1 + 0x1c0) + *(long *)((long)pvVar1 + 0x1b0) * -5;
    *(long *)((long)pvVar1 + 0x1c8) =
         *(long *)((long)pvVar1 + 0x1c8) + *(long *)((long)pvVar1 + 0x1b8) * -5;
    if (*(int *)((long)pvVar1 + 0x58) != 0) {
      if (*(N_Vector *)((long)pvVar1 + 0x138) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x138));
      }
      *(long *)((long)pvVar1 + 0x1c0) =
           *(long *)((long)pvVar1 + 0x1c0) - *(long *)((long)pvVar1 + 0x1b0);
      *(long *)((long)pvVar1 + 0x1c8) =
           *(long *)((long)pvVar1 + 0x1c8) - *(long *)((long)pvVar1 + 0x1b8);
    }
    if (*(code **)((long)pvVar1 + 0x1e8) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x1e8))(pvVar1);
    }
    free(*kinmem);
    *kinmem = (void *)0x0;
  }
  return;
}

Assistant:

void KINFree(void **kinmem)
{
  KINMem kin_mem;

  if (*kinmem == NULL) return;

  kin_mem = (KINMem) (*kinmem);
  KINFreeVectors(kin_mem);

  /* call lfree if non-NULL */

  if (kin_mem->kin_lfree != NULL) kin_mem->kin_lfree(kin_mem);

  free(*kinmem);
  *kinmem = NULL;
}